

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateDescriptorMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  FieldDescriptor *field_00;
  JavaType JVar1;
  Descriptor *pDVar2;
  FieldGeneratorInfo *pFVar3;
  int i;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  long lVar4;
  long lVar5;
  ulong uVar6;
  FieldDescriptor *field;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  map_fields;
  string local_90;
  string local_70;
  string local_50;
  
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x69) == '\0') {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&field,this->name_resolver_,*(FileDescriptor **)(pDVar2 + 0x10),true);
    UniqueFileScopeIdentifier_abi_cxx11_
              (&local_90,(java *)(this->super_MessageGenerator).descriptor_,descriptor);
    io::Printer::Print(printer,
                       "public static final com.google.protobuf.Descriptors.Descriptor\n    getDescriptor() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
                       ,"fileclass",(string *)&field,"identifier",&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)field != &local_b8) {
      operator_delete(field,local_b8._M_allocated_capacity + 1);
    }
  }
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  map_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar2 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar2 + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      field = (FieldDescriptor *)(*(long *)(pDVar2 + 0x30) + lVar4);
      JVar1 = GetJavaType(field);
      if (JVar1 == JAVATYPE_MESSAGE) {
        pDVar2 = FieldDescriptor::message_type(field);
        if (*(char *)(*(long *)(pDVar2 + 0x20) + 0x6b) == '\x01') {
          if (map_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              map_fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
            ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                      ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                        *)&map_fields,
                       (iterator)
                       map_fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&field);
          }
          else {
            *map_fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish = field;
            map_fields.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 map_fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      lVar5 = lVar5 + 1;
      pDVar2 = (this->super_MessageGenerator).descriptor_;
      lVar4 = lVar4 + 0xa8;
    } while (lVar5 < *(int *)(pDVar2 + 0x2c));
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    io::Printer::Print(printer,
                       "@SuppressWarnings({\"rawtypes\"})\nprotected com.google.protobuf.MapField internalGetMapField(\n    int number) {\n  switch (number) {\n"
                      );
    io::Printer::Indent(printer);
    io::Printer::Indent(printer);
    if (map_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        map_fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar6 = 0;
      do {
        field_00 = map_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6];
        pFVar3 = Context::GetFieldGeneratorInfo(this->context_,field_00);
        SimpleItoa_abi_cxx11_((string *)&field,(protobuf *)(ulong)*(uint *)(field_00 + 0x38),i);
        io::Printer::Print(printer,"case $number$:\n  return internalGet$capitalized_name$();\n",
                           "number",(string *)&field,"capitalized_name",&pFVar3->capitalized_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)field != &local_b8) {
          operator_delete(field,local_b8._M_allocated_capacity + 1);
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)((long)map_fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)map_fields.
                                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    io::Printer::Print(printer,
                       "default:\n  throw new RuntimeException(\n      \"Invalid map field number: \" + number);\n"
                      );
    io::Printer::Outdent(printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  }\n}\n");
  }
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&field,this->name_resolver_,(this->super_MessageGenerator).descriptor_,true);
  ClassNameResolver::GetClassName_abi_cxx11_
            (&local_90,this->name_resolver_,
             *(FileDescriptor **)((this->super_MessageGenerator).descriptor_ + 0x10),true);
  UniqueFileScopeIdentifier_abi_cxx11_
            (&local_50,(java *)(this->super_MessageGenerator).descriptor_,descriptor_00);
  local_70.field_2._M_allocated_capacity._0_2_ = 0x3356;
  local_70._M_string_length = 2;
  local_70.field_2._M_local_buf[2] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  io::Printer::Print(printer,
                     "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n    internalGetFieldAccessorTable() {\n  return $fileclass$.internal_$identifier$_fieldAccessorTable\n      .ensureFieldAccessorsInitialized(\n          $classname$.class, $classname$.Builder.class);\n}\n\n"
                     ,"classname",(string *)&field,"fileclass",&local_90,"identifier",&local_50,
                     "ver",&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT53(local_70.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_70.field_2._M_local_buf[2],
                                      local_70.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field != &local_b8) {
    operator_delete(field,local_b8._M_allocated_capacity + 1);
  }
  if (map_fields.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(map_fields.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)map_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)map_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateDescriptorMethods(io::Printer* printer) {
  if (!descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(
      "public static final com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptor() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));
  }
  std::vector<const FieldDescriptor*> map_fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (GetJavaType(field) == JAVATYPE_MESSAGE &&
        IsMapEntry(field->message_type())) {
      map_fields.push_back(field);
    }
  }
  if (!map_fields.empty()) {
    printer->Print(
      "@SuppressWarnings({\"rawtypes\"})\n"
      "protected com.google.protobuf.MapField internalGetMapField(\n"
      "    int number) {\n"
      "  switch (number) {\n");
    printer->Indent();
    printer->Indent();
    for (int i = 0; i < map_fields.size(); ++i) {
      const FieldDescriptor* field = map_fields[i];
      const FieldGeneratorInfo* info = context_->GetFieldGeneratorInfo(field);
      printer->Print(
        "case $number$:\n"
        "  return internalGet$capitalized_name$();\n",
        "number", SimpleItoa(field->number()),
        "capitalized_name", info->capitalized_name);
    }
    printer->Print(
        "default:\n"
        "  throw new RuntimeException(\n"
        "      \"Invalid map field number: \" + number);\n");
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");
  }
  printer->Print(
    "protected com.google.protobuf.GeneratedMessage$ver$.FieldAccessorTable\n"
    "    internalGetFieldAccessorTable() {\n"
    "  return $fileclass$.internal_$identifier$_fieldAccessorTable\n"
    "      .ensureFieldAccessorsInitialized(\n"
    "          $classname$.class, $classname$.Builder.class);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_),
    "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
    "identifier", UniqueFileScopeIdentifier(descriptor_),
    "ver", GeneratedCodeVersionSuffix());
}